

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.h
# Opt level: O1

bool __thiscall
TcpServer::notifyChangeEpoll
          (TcpServer *this,
          vector<std::pair<int,_EpollChangeOperation>,_std::allocator<std::pair<int,_EpollChangeOperation>_>_>
          *changes)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  __normal_iterator<const_std::pair<int,_EpollChangeOperation>_*,_std::vector<std::pair<int,_EpollChangeOperation>,_std::allocator<std::pair<int,_EpollChangeOperation>_>_>_>
  __first;
  __normal_iterator<const_std::pair<int,_EpollChangeOperation>_*,_std::vector<std::pair<int,_EpollChangeOperation>,_std::allocator<std::pair<int,_EpollChangeOperation>_>_>_>
  __last;
  bool bVar3;
  __normal_iterator<const_std::pair<int,_EpollChangeOperation>_*,_std::vector<std::pair<int,_EpollChangeOperation>,_std::allocator<std::pair<int,_EpollChangeOperation>_>_>_>
  _Var4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  vector<std::pair<int,_EpollChangeOperation>,_std::allocator<std::pair<int,_EpollChangeOperation>_>_>
  *__range1;
  const_iterator local_60;
  iterator local_40;
  
  pthread_mutex_lock((pthread_mutex_t *)&this->mutex);
  __first._M_current =
       (changes->
       super__Vector_base<std::pair<int,_EpollChangeOperation>,_std::allocator<std::pair<int,_EpollChangeOperation>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (changes->
       super__Vector_base<std::pair<int,_EpollChangeOperation>,_std::allocator<std::pair<int,_EpollChangeOperation>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  if (__first._M_current != __last._M_current) {
    p_Var1 = &(this->connections)._M_t._M_impl.super__Rb_tree_header;
    _Var4._M_current = __first._M_current;
    do {
      iVar2 = (_Var4._M_current)->first;
      p_Var6 = (this->connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var5 = &p_Var1->_M_header;
      for (; p_Var6 != (_Base_ptr)0x0; p_Var6 = (&p_Var6->_M_left)[(int)p_Var6[1]._M_color < iVar2])
      {
        if (iVar2 <= (int)p_Var6[1]._M_color) {
          p_Var5 = p_Var6;
        }
      }
      p_Var6 = &p_Var1->_M_header;
      if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
         (p_Var6 = p_Var5, iVar2 < (int)p_Var5[1]._M_color)) {
        p_Var6 = &p_Var1->_M_header;
      }
      if ((_Rb_tree_header *)p_Var6 == p_Var1) {
        bVar3 = false;
        goto LAB_00108089;
      }
      _Var4._M_current = _Var4._M_current + 1;
    } while (_Var4._M_current != __last._M_current);
  }
  local_60._M_cur =
       (this->changesTempStorage).
       super__Deque_base<std::pair<int,_EpollChangeOperation>,_std::allocator<std::pair<int,_EpollChangeOperation>_>_>
       ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_60._M_first =
       (this->changesTempStorage).
       super__Deque_base<std::pair<int,_EpollChangeOperation>,_std::allocator<std::pair<int,_EpollChangeOperation>_>_>
       ._M_impl.super__Deque_impl_data._M_finish._M_first;
  local_60._M_last =
       (this->changesTempStorage).
       super__Deque_base<std::pair<int,_EpollChangeOperation>,_std::allocator<std::pair<int,_EpollChangeOperation>_>_>
       ._M_impl.super__Deque_impl_data._M_finish._M_last;
  local_60._M_node =
       (this->changesTempStorage).
       super__Deque_base<std::pair<int,_EpollChangeOperation>,_std::allocator<std::pair<int,_EpollChangeOperation>_>_>
       ._M_impl.super__Deque_impl_data._M_finish._M_node;
  std::
  deque<std::pair<int,EpollChangeOperation>,std::allocator<std::pair<int,EpollChangeOperation>>>::
  insert<__gnu_cxx::__normal_iterator<std::pair<int,EpollChangeOperation>const*,std::vector<std::pair<int,EpollChangeOperation>,std::allocator<std::pair<int,EpollChangeOperation>>>>,void>
            (&local_40,
             (deque<std::pair<int,EpollChangeOperation>,std::allocator<std::pair<int,EpollChangeOperation>>>
              *)&this->changesTempStorage,&local_60,__first,__last);
  bVar3 = writePipeToNotify(this,'c');
LAB_00108089:
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
  return bVar3;
}

Assistant:

bool notifyChangeEpoll(
      const std::vector<std::pair<int, EpollChangeOperation>> &changes) {
    AutoMutex m(mutex);
    for (auto c : changes) {
      if (!isVaildConnection(c.first)) {
        return false;
      }
    }
    changesTempStorage.insert(changesTempStorage.end(), changes.begin(),
                              changes.end());
    return writePipeToNotify('c');
  }